

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrLib.cpp
# Opt level: O2

char * nv::Path::extension(char *str)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  ulong uVar4;
  uint uVar5;
  
  if ((str == (char *)0x0) &&
     (iVar1 = nvAbort("str != __null",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvcore/StrLib.cpp"
                      ,0x213,"static const char *nv::Path::extension(const char *)"), iVar1 == 1)) {
    raise(5);
  }
  sVar3 = strlen(str);
  uVar2 = (uint)sVar3;
  uVar4 = sVar3 & 0xffffffff;
  while (uVar5 = (uint)uVar4, 0 < (int)uVar5) {
    if ((str[uVar4] == '.') || (uVar4 = (ulong)(uVar5 - 1), uVar5 = uVar2, str[uVar4] == '/'))
    goto LAB_001b320e;
  }
  uVar5 = uVar2;
  if (-1 < (int)uVar2) {
    uVar4 = (ulong)(uVar2 & 0x7fffffff);
    goto LAB_001b3210;
  }
LAB_001b320e:
  uVar4 = (ulong)(int)uVar5;
LAB_001b3210:
  return str + uVar4;
}

Assistant:

const char * Path::extension(const char * str)
{
	nvCheck( str != NULL );

	int length, l;
	l = length = (int)strlen( str );
	while( length > 0 && str[length] != '.' ) {
		length--;
		if( str[length] == separator() ) {
			return &str[l];		// no extension
		}
	}
	if( length == 0 ) {
		return &str[l];
	}
	return &str[length];
}